

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClassMethodPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassMethodPrototypeSyntax,slang::syntax::ClassMethodPrototypeSyntax_const&>
          (BumpAllocator *this,ClassMethodPrototypeSyntax *args)

{
  ClassMethodPrototypeSyntax *this_00;
  
  this_00 = (ClassMethodPrototypeSyntax *)allocate(this,0xa0,8);
  slang::syntax::ClassMethodPrototypeSyntax::ClassMethodPrototypeSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }